

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O2

char * tun_format(btbb_packet *pkt)

{
  uint uVar1;
  uint8_t uVar2;
  uint32_t *puVar3;
  char *air_order;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = pkt->payload_length;
  puVar3 = (uint32_t *)malloc((long)(int)uVar1 + 9);
  *puVar3 = pkt->clock;
  *(uint8_t *)(puVar3 + 1) = pkt->channel;
  *(byte *)((long)puVar3 + 5) = (byte)pkt->flags & 2 | (byte)(pkt->flags >> 5) & 1;
  uVar2 = air_to_host8(pkt->packet_header,7);
  *(uint8_t *)((long)puVar3 + 6) = uVar2;
  uVar2 = air_to_host8(pkt->packet_header + 7,3);
  *(uint8_t *)((long)puVar3 + 7) = uVar2;
  uVar2 = air_to_host8(pkt->packet_header + 10,8);
  *(uint8_t *)(puVar3 + 2) = uVar2;
  air_order = pkt->payload;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = air_to_host8(air_order,8);
    *(uint8_t *)((long)puVar3 + uVar5 + 9) = uVar2;
    air_order = air_order + 8;
  }
  return (char *)puVar3;
}

Assistant:

char *tun_format(btbb_packet* pkt)
{
	/* include 6 bytes for meta data, 3 bytes for packet header */
	int length = 9 + pkt->payload_length;
	char *tun_format = (char *) malloc(length);
	int i;

	/* meta data */
	tun_format[0] = pkt->clock & 0xff;
	tun_format[1] = (pkt->clock >> 8) & 0xff;
	tun_format[2] = (pkt->clock >> 16) & 0xff;
	tun_format[3] = (pkt->clock >> 24) & 0xff;
	tun_format[4] = pkt->channel;
	tun_format[5] = btbb_packet_get_flag(pkt, BTBB_CLK27_VALID) |
		(btbb_packet_get_flag(pkt, BTBB_NAP_VALID) << 1);

	/* packet header modified to fit byte boundaries */
	/* lt_addr and type */
	tun_format[6] = (char) air_to_host8(&pkt->packet_header[0], 7);
	/* flags */
	tun_format[7] = (char) air_to_host8(&pkt->packet_header[7], 3);
	/* HEC */
	tun_format[8] = (char) air_to_host8(&pkt->packet_header[10], 8);

	for(i=0;i<pkt->payload_length;i++)
		tun_format[i+9] = (char) air_to_host8(&pkt->payload[i*8], 8);

	return tun_format;
}